

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

int Find(Vector *V,ElementType x)

{
  long lVar1;
  
  if (0 < (long)V->VectorLength) {
    lVar1 = 0;
    do {
      if (V->elements[lVar1] == x) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (V->VectorLength != lVar1);
  }
  return -1;
}

Assistant:

int Find(Vector *V,ElementType x)  //在向量中查找
{
    int i;
    for(i = 0; i < V->VectorLength; i++)
        if(V->elements[i]==x)
            return i;  //找到返回结点序号
    return -1;  //未找到
}